

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::Data::Data(Data *this,int numThreads)

{
  undefined4 in_ESI;
  long in_RDI;
  V2f *in_stack_00000028;
  float in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  Header *in_stack_00000040;
  Vec2<float> local_14;
  undefined4 local_c;
  
  local_c = in_ESI;
  std::mutex::mutex((mutex *)0xa495cc);
  Imath_2_5::Vec2<float>::Vec2(&local_14,0.0,0.0);
  Header::Header(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000034,
                 in_stack_00000028,this._4_4_,(LineOrder)this,numThreads);
  *(undefined1 *)(in_RDI + 100) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  FrameBuffer::FrameBuffer((FrameBuffer *)0xa4963f);
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  *(undefined8 *)(in_RDI + 200) = 0;
  *(undefined4 *)(in_RDI + 0xd0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xd8) = local_c;
  *(undefined4 *)(in_RDI + 0xdc) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined1 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined1 *)(in_RDI + 0x100) = 0;
  return;
}

Assistant:

InputFile::Data::Data (int numThreads):
    isTiled (false),
    tFile (0),
    sFile (0),
    dsFile(0),
    cachedBuffer (0),
    compositor(0),
    cachedTileY (-1),
    numThreads (numThreads),
    partNumber (-1),
    part(NULL),
    multiPartBackwardSupport (false),
    multiPartFile (0),
    _streamData(0),
    _deleteStream(false)
           
{
    // empty
}